

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void avx::Threshold(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,
                   uint8_t *outYEnd,uint8_t threshold,uint32_t simdWidth,uint32_t totalSimdWidth,
                   uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  byte bVar6;
  undefined1 uVar7;
  undefined1 *puVar8;
  undefined8 *in_RCX;
  ulong *in_RDX;
  uint in_ESI;
  uint in_EDI;
  undefined8 *in_R8;
  byte in_R9B;
  undefined1 auVar9 [16];
  uint in_stack_00000008;
  simd *src1End;
  simd *dst;
  simd *src1;
  simd compare;
  char compareValue;
  simd mask;
  char maskValue;
  undefined1 *local_248;
  byte *local_240;
  undefined8 *local_230;
  ulong *local_228;
  undefined8 *local_1a0;
  ulong *local_198;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  ulong local_c0;
  ulong uStack_b8;
  ulong uStack_b0;
  ulong uStack_a8;
  
  local_1a0 = in_RCX;
  if (in_R9B == 0) {
    for (; local_1a0 != in_R8; local_1a0 = (undefined8 *)((long)local_1a0 + (ulong)in_ESI)) {
      memset(local_1a0,0xff,(ulong)(simdWidth + totalSimdWidth));
    }
  }
  else {
    auVar1 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar1 = vpinsrb_avx(auVar1,0x80,2);
    auVar1 = vpinsrb_avx(auVar1,0x80,3);
    auVar1 = vpinsrb_avx(auVar1,0x80,4);
    auVar1 = vpinsrb_avx(auVar1,0x80,5);
    auVar1 = vpinsrb_avx(auVar1,0x80,6);
    auVar1 = vpinsrb_avx(auVar1,0x80,7);
    auVar1 = vpinsrb_avx(auVar1,0x80,8);
    auVar1 = vpinsrb_avx(auVar1,0x80,9);
    auVar1 = vpinsrb_avx(auVar1,0x80,10);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xe);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar2 = vpinsrb_avx(auVar2,0x80,2);
    auVar2 = vpinsrb_avx(auVar2,0x80,3);
    auVar2 = vpinsrb_avx(auVar2,0x80,4);
    auVar2 = vpinsrb_avx(auVar2,0x80,5);
    auVar2 = vpinsrb_avx(auVar2,0x80,6);
    auVar2 = vpinsrb_avx(auVar2,0x80,7);
    auVar2 = vpinsrb_avx(auVar2,0x80,8);
    auVar2 = vpinsrb_avx(auVar2,0x80,9);
    auVar2 = vpinsrb_avx(auVar2,0x80,10);
    auVar2 = vpinsrb_avx(auVar2,0x80,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x80,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x80,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x80,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x80,0xf);
    local_c0 = auVar1._0_8_;
    uStack_b8 = auVar1._8_8_;
    uStack_b0 = auVar2._0_8_;
    uStack_a8 = auVar2._8_8_;
    bVar6 = in_R9B + 0x7f;
    auVar1 = vpinsrb_avx(ZEXT116(bVar6),(uint)bVar6,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,2);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,3);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,4);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,5);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,6);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,7);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,8);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,9);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,10);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,0xb);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,0xc);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,0xd);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,0xe);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar6,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(bVar6),(uint)bVar6,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,0xe);
    auVar2 = vpinsrb_avx(auVar2,(uint)bVar6,0xf);
    auVar9 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    uStack_f0 = auVar9._0_8_;
    uStack_e8 = auVar9._8_8_;
    local_198 = in_RDX;
    for (; local_1a0 != in_R8; local_1a0 = (undefined8 *)((long)local_1a0 + (ulong)in_ESI)) {
      local_230 = local_1a0;
      for (local_228 = local_198; local_228 != local_198 + (ulong)in_stack_00000008 * 4;
          local_228 = local_228 + 4) {
        auVar5._8_8_ = local_228[1] ^ uStack_b8;
        auVar5._0_8_ = *local_228 ^ local_c0;
        auVar5._16_8_ = local_228[2] ^ uStack_b0;
        auVar5._24_8_ = local_228[3] ^ uStack_a8;
        auVar4._16_8_ = uStack_f0;
        auVar4._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
        auVar4._24_8_ = uStack_e8;
        uVar3 = vpcmpgtb_avx512vl(auVar5,auVar4);
        auVar4 = vpmovm2b_avx512vl(uVar3);
        local_180 = auVar4._0_8_;
        uStack_178 = auVar4._8_8_;
        uStack_170 = auVar4._16_8_;
        uStack_168 = auVar4._24_8_;
        *local_230 = local_180;
        local_230[1] = uStack_178;
        local_230[2] = uStack_170;
        local_230[3] = uStack_168;
        local_230 = local_230 + 4;
      }
      if (totalSimdWidth != 0) {
        local_240 = (byte *)((long)local_198 + (ulong)simdWidth);
        local_248 = (undefined1 *)((long)local_1a0 + (ulong)simdWidth);
        puVar8 = local_248 + totalSimdWidth;
        for (; local_248 != puVar8; local_248 = local_248 + 1) {
          uVar7 = 0xff;
          if (*local_240 < in_R9B) {
            uVar7 = 0;
          }
          *local_248 = uVar7;
          local_240 = local_240 + 1;
        }
      }
      local_198 = (ulong *)((long)local_198 + (ulong)in_EDI);
    }
  }
  return;
}

Assistant:

void Threshold( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd, uint8_t threshold,
                    uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        // AVX does not have command "great or equal to" so we have 2 situations:
        // when threshold value is 0 and it is not
        if( threshold > 0 ) {
            const char maskValue = static_cast<char>(0x80u);
            const simd mask = _mm256_set_epi8(
                maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue );

            const char compareValue = static_cast<char>((threshold - 1) ^ 0x80u);
            const simd compare = _mm256_set_epi8(
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue );

            for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
                const simd * src1 = reinterpret_cast <const simd*> (inY);
                simd       * dst  = reinterpret_cast <simd*> (outY);

                const simd * src1End = src1 + simdWidth;

                for( ; src1 != src1End; ++src1, ++dst )
                    _mm256_storeu_si256( dst, _mm256_cmpgt_epi8( _mm256_xor_si256( _mm256_loadu_si256( src1 ), mask ), compare ) );

                if( nonSimdWidth > 0 ) {
                    const uint8_t * inX  = inY  + totalSimdWidth;
                    uint8_t       * outX = outY + totalSimdWidth;

                    const uint8_t * outXEnd = outX + nonSimdWidth;

                    for( ; outX != outXEnd; ++outX, ++inX )
                        (*outX) = (*inX) < threshold ? 0 : 255;
                }
            }
        }
        else {
            for( ; outY != outYEnd; outY += rowSizeOut )
                memset( outY, 255u, sizeof( uint8_t ) * (totalSimdWidth + nonSimdWidth) );
        }
    }